

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Options::WarningsOptionParser::parseIntoConfig
          (WarningsOptionParser *this,Command *cmd,ConfigData *config)

{
  ulong uVar1;
  ConfigData *this_00;
  bool bVar2;
  size_t sVar3;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_48;
  ulong local_28;
  size_t i;
  ConfigData *config_local;
  Command *cmd_local;
  WarningsOptionParser *this_local;
  
  local_28 = 0;
  i = (size_t)config;
  config_local = (ConfigData *)cmd;
  cmd_local = (Command *)this;
  while( true ) {
    uVar1 = local_28;
    sVar3 = Command::argsCount((Command *)config_local);
    if (sVar3 <= uVar1) {
      return;
    }
    Command::operator[][abi_cxx11_(&local_48,(Command *)config_local,local_28);
    bVar2 = std::operator==(&local_48,"NoAssertions");
    std::__cxx11::string::~string((string *)&local_48);
    this_00 = config_local;
    if (!bVar2) break;
    *(uint *)(i + 0xb8) = *(uint *)(i + 0xb8) | 1;
    local_28 = local_28 + 1;
  }
  Command::operator[][abi_cxx11_(&local_98,(Command *)config_local,local_28);
  std::operator+(&local_78,"Unrecognised warning: ",&local_98);
  Command::raiseError((Command *)this_00,&local_78);
}

Assistant:

virtual void parseIntoConfig( const Command& cmd, ConfigData& config ) {
                for( std::size_t i = 0; i < cmd.argsCount(); ++i ) {
                    if( cmd[i] == "NoAssertions" )
                        config.warnings = (ConfigData::WarnAbout::What)( config.warnings | ConfigData::WarnAbout::NoAssertions );
                    else
                        cmd.raiseError( "Unrecognised warning: " + cmd[i] );
                }
            }